

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::post_trackers(torrent *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_> t;
  undefined1 auStack_48 [56];
  
  trackers((vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
            *)(auStack_48 + 0x10),this);
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)auStack_48);
  alert_manager::
  emplace_alert<libtorrent::tracker_list_alert,libtorrent::torrent_handle,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>
            ((alert_manager *)CONCAT44(extraout_var,iVar2),(torrent_handle *)auStack_48,
             (vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              *)(auStack_48 + 0x10));
  if ((piece_picker *)auStack_48._8_8_ != (piece_picker *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(auStack_48._8_8_ + 0xc);
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = *(_Atomic_word *)(auStack_48._8_8_ + 0xc);
      *(int *)(auStack_48._8_8_ + 0xc) = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(*(_func_int ***)auStack_48._8_8_)[3])();
    }
  }
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::~vector((vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             *)(auStack_48 + 0x10));
  return;
}

Assistant:

void torrent::post_trackers()
	{
		auto t = trackers();
		m_ses.alerts().emplace_alert<tracker_list_alert>(get_handle(), std::move(t));
	}